

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_crypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *input,size_t ilen,
              uchar *output,size_t *olen)

{
  size_t local_50;
  size_t finish_olen;
  uchar *puStack_40;
  int ret;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  size_t iv_len_local;
  uchar *iv_local;
  mbedtls_cipher_context_t *ctx_local;
  
  puStack_40 = output;
  output_local = (uchar *)ilen;
  ilen_local = (size_t)input;
  input_local = (uchar *)iv_len;
  iv_len_local = (size_t)iv;
  iv_local = (uchar *)ctx;
  finish_olen._4_4_ = mbedtls_cipher_set_iv(ctx,iv,iv_len);
  ctx_local._4_4_ = finish_olen._4_4_;
  if ((((finish_olen._4_4_ == 0) &&
       (finish_olen._4_4_ = mbedtls_cipher_reset((mbedtls_cipher_context_t *)iv_local),
       ctx_local._4_4_ = finish_olen._4_4_, finish_olen._4_4_ == 0)) &&
      (finish_olen._4_4_ =
            mbedtls_cipher_update
                      ((mbedtls_cipher_context_t *)iv_local,(uchar *)ilen_local,(size_t)output_local
                       ,puStack_40,olen), ctx_local._4_4_ = finish_olen._4_4_,
      finish_olen._4_4_ == 0)) &&
     (ctx_local._4_4_ =
           mbedtls_cipher_finish((mbedtls_cipher_context_t *)iv_local,puStack_40 + *olen,&local_50),
     ctx_local._4_4_ == 0)) {
    *olen = local_50 + *olen;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_crypt( mbedtls_cipher_context_t *ctx,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *input, size_t ilen,
                  unsigned char *output, size_t *olen )
{
    int ret;
    size_t finish_olen;

    if( ( ret = mbedtls_cipher_set_iv( ctx, iv, iv_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_reset( ctx ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_update( ctx, input, ilen, output, olen ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_finish( ctx, output + *olen, &finish_olen ) ) != 0 )
        return( ret );

    *olen += finish_olen;

    return( 0 );
}